

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O1

void Diligent::FormatStrSS<std::__cxx11::stringstream,char[29],std::__cxx11::string>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char (*FirstArg) [29],
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *RestArgs)

{
  size_t sVar1;
  
  sVar1 = strlen(*FirstArg);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(ss + 0x10),*FirstArg,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(ss + 0x10),(RestArgs->_M_dataplus)._M_p,RestArgs->_M_string_length);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}